

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void __thiscall
flatbuffers::FlatCompiler::AnnotateBinaries
          (FlatCompiler *this,uint8_t *binary_schema,uint64_t binary_schema_size,
          FlatCOptions *options)

{
  undefined8 filename_00;
  bool bVar1;
  flatbuffers *this_00;
  uint8_t *binary_00;
  uint64_t binary_length;
  FlatCOptions *buf;
  allocator<char> local_2d1;
  undefined1 local_2d0 [80];
  undefined1 local_280 [8];
  AnnotatedBinaryTextGenerator text_generator;
  Options text_gen_opts;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  annotations;
  BinaryAnnotator binary_annotator;
  bool is_size_prefixed;
  size_t binary_size;
  uint8_t *binary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70 [8];
  string binary_contents;
  string *filename;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *schema_filename;
  FlatCOptions *options_local;
  uint64_t binary_schema_size_local;
  uint8_t *binary_schema_local;
  FlatCompiler *this_local;
  
  buf = options;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&options->filenames);
  filename = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&options->filenames);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&filename), bVar1) {
    binary_contents.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string(local_70);
    this_00 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(this_00,(char *)0x1,SUB81(local_70,0),(string *)buf);
    if (bVar1) {
      binary_00 = (uint8_t *)std::__cxx11::string::c_str();
      binary_length = std::__cxx11::string::size();
      BinaryAnnotator::BinaryAnnotator
                ((BinaryAnnotator *)&annotations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 binary_schema,binary_schema_size,binary_00,binary_length,
                 (bool)((options->opts).size_prefixed & 1));
      BinaryAnnotator::Annotate
                ((map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                  *)&text_gen_opts.include_vector_contents,
                 (BinaryAnnotator *)&annotations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      AnnotatedBinaryTextGenerator::Options::Options
                ((Options *)&text_generator.options_.include_vector_contents);
      text_gen_opts.output_extension.field_2._M_local_buf[8] =
           options->annotate_include_vector_contents & 1;
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::map((map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
             *)(local_2d0 + 0x20),
            (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
             *)&text_gen_opts.include_vector_contents);
      AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
                ((AnnotatedBinaryTextGenerator *)local_280,
                 (Options *)&text_generator.options_.include_vector_contents,
                 (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                  *)(local_2d0 + 0x20),binary_00,binary_length);
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::~map((map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
              *)(local_2d0 + 0x20));
      filename_00 = binary_contents.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_2d0,"",&local_2d1);
      buf = (FlatCOptions *)local_2d0;
      AnnotatedBinaryTextGenerator::Generate
                ((AnnotatedBinaryTextGenerator *)local_280,(string *)filename_00,
                 &options->annotate_schema,(string *)buf);
      std::__cxx11::string::~string((string *)local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      AnnotatedBinaryTextGenerator::~AnnotatedBinaryTextGenerator
                ((AnnotatedBinaryTextGenerator *)local_280);
      AnnotatedBinaryTextGenerator::Options::~Options
                ((Options *)&text_generator.options_.include_vector_contents);
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::~map((map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
              *)&text_gen_opts.include_vector_contents);
      BinaryAnnotator::~BinaryAnnotator
                ((BinaryAnnotator *)&annotations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      std::operator+(&local_a0,"unable to load binary file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     binary_contents.field_2._8_8_);
      Warn(this,&local_a0,true);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void FlatCompiler::AnnotateBinaries(const uint8_t *binary_schema,
                                    const uint64_t binary_schema_size,
                                    const FlatCOptions &options) {
  const std::string &schema_filename = options.annotate_schema;

  for (const std::string &filename : options.filenames) {
    std::string binary_contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &binary_contents)) {
      Warn("unable to load binary file: " + filename);
      continue;
    }

    const uint8_t *binary =
        reinterpret_cast<const uint8_t *>(binary_contents.c_str());
    const size_t binary_size = binary_contents.size();
    const bool is_size_prefixed = options.opts.size_prefixed;

    flatbuffers::BinaryAnnotator binary_annotator(
        binary_schema, binary_schema_size, binary, binary_size,
        is_size_prefixed);

    auto annotations = binary_annotator.Annotate();

    flatbuffers::AnnotatedBinaryTextGenerator::Options text_gen_opts;
    text_gen_opts.include_vector_contents =
        options.annotate_include_vector_contents;

    // TODO(dbaileychess): Right now we just support a single text-based
    // output of the annotated binary schema, which we generate here. We
    // could output the raw annotations instead and have third-party tools
    // use them to generate their own output.
    flatbuffers::AnnotatedBinaryTextGenerator text_generator(
        text_gen_opts, annotations, binary, binary_size);

    text_generator.Generate(filename, schema_filename);
  }
}